

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O1

void __thiscall WorkSpace::WorkSpace(WorkSpace *this,string *filename)

{
  pointer pcVar1;
  int iVar2;
  string local_50;
  
  SequenceDistanceGraph::SequenceDistanceGraph(&this->sdg,this);
  memset(&this->paired_reads_datastores,0,0x90);
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::reserve
            (&this->linked_reads_datastores,100);
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::reserve
            (&this->paired_reads_datastores,100);
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::reserve
            (&this->long_reads_datastores,100);
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::reserve(&this->kmer_counters,100);
  iVar2 = std::__cxx11::string::compare((char *)filename);
  if (iVar2 != 0) {
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + filename->_M_string_length);
    load_from_disk(this,&local_50,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

WorkSpace::WorkSpace(const std::string &filename) : sdg(*this) {
    linked_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    paired_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    long_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    kmer_counters.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    if (filename!="") load_from_disk(filename);
}